

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_enc.c
# Opt level: O0

int QuantizeSingle(int16_t *v,VP8Matrix *mtx)

{
  ushort *in_RSI;
  short *in_RDI;
  bool bVar1;
  int err;
  int qV;
  int sign;
  int V;
  int local_2c;
  uint32_t local_1c;
  int local_4;
  
  local_1c = (uint32_t)*in_RDI;
  bVar1 = (int)local_1c < 0;
  if (bVar1) {
    local_1c = -local_1c;
  }
  if (*(int *)(in_RSI + 0x40) < (int)local_1c) {
    local_2c = QUANTDIV(local_1c,(uint)in_RSI[0x10],*(uint32_t *)(in_RSI + 0x20));
    local_2c = local_2c * (uint)*in_RSI;
    local_1c = local_1c - local_2c;
    if (bVar1) {
      local_2c = -local_2c;
    }
    *in_RDI = (short)local_2c;
    if (bVar1) {
      local_1c = -local_1c;
    }
  }
  else {
    *in_RDI = 0;
    if (bVar1) {
      local_1c = -local_1c;
    }
  }
  local_4 = (int)local_1c >> 1;
  return local_4;
}

Assistant:

static int QuantizeSingle(int16_t* WEBP_RESTRICT const v,
                          const VP8Matrix* WEBP_RESTRICT const mtx) {
  int V = *v;
  const int sign = (V < 0);
  if (sign) V = -V;
  if (V > (int)mtx->zthresh[0]) {
    const int qV = QUANTDIV(V, mtx->iq[0], mtx->bias[0]) * mtx->q[0];
    const int err = (V - qV);
    *v = sign ? -qV : qV;
    return (sign ? -err : err) >> DSCALE;
  }
  *v = 0;
  return (sign ? -V : V) >> DSCALE;
}